

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_if::run_impl(statement_if *this)

{
  context_t *c;
  bool bVar1;
  _Elt_pointer ppsVar2;
  element_type *peVar3;
  bool *pbVar4;
  _Elt_pointer ppsVar5;
  _Elt_pointer ppsVar6;
  _Map_pointer pppsVar7;
  scope_guard scope;
  slot_type *local_98;
  
  local_98 = (slot_type *)(this->mTree).mRoot;
  runtime_type::parse_expr
            ((runtime_type *)&stack0xffffffffffffff60,
             (iterator *)
             (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             SUB81(&stack0xffffffffffffff68,0));
  pbVar4 = cs_impl::any::const_val<bool>((any *)&stack0xffffffffffffff60);
  bVar1 = *pbVar4;
  cs_impl::any::recycle((any *)&stack0xffffffffffffff60);
  if (bVar1 == true) {
    c = &(this->super_statement_base).context;
    scope_guard::scope_guard((scope_guard *)&stack0xffffffffffffff60,c);
    ppsVar5 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_cur;
    ppsVar6 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar7 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    ppsVar2 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    while (ppsVar5 != ppsVar2) {
      statement_base::run(*ppsVar5);
      peVar3 = (((c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((peVar3->return_fcall != false) || (peVar3->break_block != false)) ||
         (peVar3->continue_block != false)) break;
      ppsVar5 = ppsVar5 + 1;
      if (ppsVar5 == ppsVar6) {
        ppsVar5 = pppsVar7[1];
        pppsVar7 = pppsVar7 + 1;
        ppsVar6 = ppsVar5 + 0x40;
      }
    }
    scope_guard::~scope_guard((scope_guard *)&stack0xffffffffffffff60);
  }
  return;
}

Assistant:

void statement_if::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->parse_expr(mTree.root()).const_val<boolean>()) {
			scope_guard scope(context);
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall || context->instance->break_block ||
				        context->instance->continue_block)
					break;
			}
		}
	}